

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# close.c
# Opt level: O0

void lws_remove_child_from_any_parent(lws *wsi)

{
  bool bVar1;
  lws **pplStack_18;
  int seen;
  lws **pwsi;
  lws *wsi_local;
  
  bVar1 = false;
  if (wsi->parent != (lws *)0x0) {
    for (pplStack_18 = &wsi->parent->child_list; *pplStack_18 != (lws *)0x0;
        pplStack_18 = &(*pplStack_18)->sibling_list) {
      if (*pplStack_18 == wsi) {
        _lws_log(8,"%s: detach %p from parent %p\n","lws_remove_child_from_any_parent",wsi,
                 wsi->parent);
        if (wsi->parent->protocol != (lws_protocols *)0x0) {
          (*wsi->parent->protocol->callback)
                    (wsi,LWS_CALLBACK_CHILD_CLOSING,wsi->parent->user_space,wsi,0);
        }
        *pplStack_18 = wsi->sibling_list;
        bVar1 = true;
        break;
      }
    }
    if (!bVar1) {
      _lws_log(1,"%s: failed to detach from parent\n","lws_remove_child_from_any_parent");
    }
    wsi->parent = (lws *)0x0;
  }
  return;
}

Assistant:

void
lws_remove_child_from_any_parent(struct lws *wsi)
{
	struct lws **pwsi;
	int seen = 0;

	if (!wsi->parent)
		return;

	/* detach ourselves from parent's child list */
	pwsi = &wsi->parent->child_list;
	while (*pwsi) {
		if (*pwsi == wsi) {
			lwsl_info("%s: detach %p from parent %p\n", __func__,
				  wsi, wsi->parent);

			if (wsi->parent->protocol)
				wsi->parent->protocol->callback(wsi,
						LWS_CALLBACK_CHILD_CLOSING,
					       wsi->parent->user_space, wsi, 0);

			*pwsi = wsi->sibling_list;
			seen = 1;
			break;
		}
		pwsi = &(*pwsi)->sibling_list;
	}
	if (!seen)
		lwsl_err("%s: failed to detach from parent\n", __func__);

	wsi->parent = NULL;
}